

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O2

TimerHolder __thiscall
Liby::EventLoop::runAfter(EventLoop *this,Timestamp *timestamp,BasicHandler *handler)

{
  Timestamp *timeout;
  long lVar1;
  TimerHolder TVar2;
  _Any_data local_48;
  long local_38;
  long lStack_30;
  
  timeout = (Timestamp *)timestamp[1].tv_.tv_sec;
  Timestamp::now();
  local_48._M_unused._0_8_ =
       (undefined8)(local_38 + *(long *)&(handler->super__Function_base)._M_functor);
  local_48._8_8_ = lStack_30 + *(long *)((long)&(handler->super__Function_base)._M_functor + 8);
  if (1000000 < (uint)local_48._8_8_) {
    lVar1 = (long)local_48._8_8_ / 1000000;
    local_48._8_8_ = (long)local_48._8_8_ % 1000000;
    local_48._M_unused._0_8_ = (undefined8)((long)local_48._M_unused._0_8_ + lVar1);
  }
  TVar2 = TimerQueue::insert((TimerQueue *)this,timeout,(BasicHandler *)&local_48);
  TVar2.timerPtr_.super___shared_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (TimerHolder)TVar2.timerPtr_.super___shared_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TimerHolder EventLoop::runAfter(const Timestamp &timestamp,
                                const BasicHandler &handler) {
    return tqueue_->insert(timestamp + Timestamp::now(), handler);
}